

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  PlatformInterface *pPVar2;
  bool bVar3;
  deUint32 dVar4;
  VkAllocationCallbacks *pVVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  deUint32 dVar8;
  Parameters *pPVar9;
  Parameters *extraout_RDX;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_ac8;
  Environment rootEnv;
  Environment local_a68;
  DeterministicFailAllocator objAllocator;
  undefined1 local_9d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c8 [23];
  AllocationCallbackRecorder recorder;
  AllocationCallbackRecorder resCallbacks;
  Resources res;
  EnvClone resEnv;
  
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&resCallbacks,pVVar5,0x80);
  pPVar2 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  rootEnv.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  rootEnv.programBinaries = context->m_progCollection;
  rootEnv.allocationCallbacks =
       &resCallbacks.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  rootEnv.maxResourceConsumers = 1;
  rootEnv.vkp = pPVar2;
  rootEnv.vkd = pDVar6;
  rootEnv.device = pVVar7;
  dVar4 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  dVar8 = 0x400;
  if (dVar4 != 0) {
    dVar8 = dVar4;
  }
  dVar4 = dVar8;
  local_9d8._0_8_ = getDefaulDeviceParameters(context);
  EnvClone::EnvClone(&resEnv,&rootEnv,(Parameters *)local_9d8,dVar4);
  ComputePipeline::Resources::Resources(&res,&resEnv.env,extraout_RDX);
  poVar1 = (ostringstream *)(local_9d8 + 8);
  if (dVar8 != 0) {
    pVVar5 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&objAllocator,pVVar5,MODE_COUNT_AND_FAIL,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&recorder,&objAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    pPVar9 = (Parameters *)(ulong)resEnv.env.queueFamilyIndex;
    local_a68.vkp = resEnv.env.vkp;
    local_a68.vkd = resEnv.env.vkd;
    local_a68.device = resEnv.env.device;
    local_a68.queueFamilyIndex = resEnv.env.queueFamilyIndex;
    local_a68.programBinaries = resEnv.env.programBinaries;
    local_a68.allocationCallbacks =
         &recorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_a68.maxResourceConsumers = resEnv.env.maxResourceConsumers;
    local_9d8._0_8_ = context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Trying to create object with ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," allocation");
    std::operator<<((ostream *)poVar1,"s");
    std::operator<<((ostream *)poVar1," passing");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    ComputePipeline::create
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_ac8,&local_a68,&res,pPVar9);
    local_9c8[0]._M_allocated_capacity = local_ac8.m_data.deleter.m_device;
    local_9c8[0]._8_8_ = local_ac8.m_data.deleter.m_allocator;
    local_9d8._0_8_ = local_ac8.m_data.object.m_internal;
    local_9d8._8_8_ = local_ac8.m_data.deleter.m_deviceIface;
    local_ac8.m_data.object.m_internal = 0;
    local_ac8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_ac8.m_data.deleter.m_device = (VkDevice)0x0;
    local_ac8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_ac8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_9d8);
    bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&recorder,0);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_9d8,"Invalid allocation callback",(allocator<char> *)&local_ac8);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_9d8);
      std::__cxx11::string::~string((string *)local_9d8);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      ComputePipeline::Resources::~Resources(&res);
      EnvClone::~EnvClone(&resEnv);
      goto LAB_00485e2c;
    }
    local_9d8._0_8_ = context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_9d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Object construction succeeded! ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
  }
  ComputePipeline::Resources::~Resources(&res);
  EnvClone::~EnvClone(&resEnv);
  bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&resCallbacks,0);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resEnv,"Allocation callbacks not called",(allocator<char> *)local_9d8);
    __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&resEnv)
    ;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resEnv,"Invalid allocation callback",(allocator<char> *)local_9d8);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&resEnv);
  }
  std::__cxx11::string::~string((string *)&resEnv);
LAB_00485e2c:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&resCallbacks);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}